

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

deInt64 vkt::SpirVAssembly::anon_unknown_5::randomInt64LogDistributed(Random *rnd)

{
  bool bVar1;
  deUint32 dVar2;
  deUint64 dVar3;
  ulong uVar4;
  ulong uVar5;
  
  dVar3 = de::Random::getUint64(rnd);
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  uVar5 = ~(-1L << ((char)((ulong)dVar2 % 0x3f) + 1U & 0x3f)) & dVar3;
  bVar1 = de::Random::getBool(rnd);
  uVar4 = -uVar5;
  if (!bVar1) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

deInt64 randomInt64LogDistributed (de::Random& rnd)
{
	deInt64 val = rnd.getUint64();
	val &= (1ull << rnd.getInt(1, 63)) - 1;
	if (rnd.getBool())
		val = -val;
	return val;
}